

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddUnate.c
# Opt level: O0

void Extra_UnateInfoPrint(Extra_UnateInfo_t *p)

{
  void *__s;
  int local_1c;
  int i;
  char *pBuffer;
  Extra_UnateInfo_t *p_local;
  
  __s = malloc((long)(p->nVarsMax + 1));
  memset(__s,0x20,(long)p->nVarsMax);
  *(undefined1 *)((long)__s + (long)p->nVarsMax) = 0;
  for (local_1c = 0; local_1c < p->nVars; local_1c = local_1c + 1) {
    if ((int)p->pVars[local_1c] < 0) {
      *(undefined1 *)((long)__s + (ulong)((uint)p->pVars[local_1c] & 0x3fffffff)) = 0x6e;
    }
    else if (((uint)p->pVars[local_1c] >> 0x1e & 1) == 0) {
      *(undefined1 *)((long)__s + (ulong)((uint)p->pVars[local_1c] & 0x3fffffff)) = 0x2e;
    }
    else {
      *(undefined1 *)((long)__s + (ulong)((uint)p->pVars[local_1c] & 0x3fffffff)) = 0x70;
    }
  }
  printf("%s\n",__s);
  if (__s != (void *)0x0) {
    free(__s);
  }
  return;
}

Assistant:

void Extra_UnateInfoPrint( Extra_UnateInfo_t * p )
{
    char * pBuffer;
    int i;
    pBuffer = ABC_ALLOC( char, p->nVarsMax+1 );
    memset( pBuffer, ' ', (size_t)p->nVarsMax );
    pBuffer[p->nVarsMax] = 0;
    for ( i = 0; i < p->nVars; i++ )
        if ( p->pVars[i].Neg )
            pBuffer[ p->pVars[i].iVar ] = 'n';
        else if ( p->pVars[i].Pos )
            pBuffer[ p->pVars[i].iVar ] = 'p';
        else
            pBuffer[ p->pVars[i].iVar ] = '.';
    printf( "%s\n", pBuffer );
    ABC_FREE( pBuffer );
}